

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Opnd * __thiscall
Lowerer::GetInlineCacheFromFuncObjectForRuntimeUse
          (Lowerer *this,Instr *instr,PropertySymOpnd *propSymOpnd,bool isHelper)

{
  bool bVar1;
  RegOpnd *pRVar2;
  Instr *pIVar3;
  RegOpnd *pRVar4;
  IndirOpnd *pIVar5;
  LabelInstr *target;
  RegOpnd *indexOpnd;
  IntConstOpnd *src;
  LabelInstr *target_00;
  AddrOpnd *src_00;
  undefined7 in_register_00000009;
  int32 local_3c;
  undefined4 local_38;
  int inlineCacheOffset;
  
  inlineCacheOffset._3_1_ = LowererMDArch::GetDefaultIndirScale();
  pRVar2 = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar3 = IR::Instr::New(Ld_A,&pRVar2->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(instr,pIVar3);
  LoadFuncExpression(this,pIVar3);
  pRVar4 = IR::RegOpnd::New(TyUint64,instr->m_func);
  pIVar5 = IR::IndirOpnd::New(pRVar2,0x40,TyUint8,instr->m_func,false);
  InsertMove(&pRVar4->super_Opnd,&pIVar5->super_Opnd,instr,true);
  local_38 = (undefined4)CONCAT71(in_register_00000009,isHelper);
  target = IR::LabelInstr::New(Label,instr->m_func,isHelper);
  InsertTest(&pRVar4->super_Opnd,&pRVar4->super_Opnd,instr);
  InsertBranch(BrEq_A,false,target,instr);
  pRVar4 = IR::RegOpnd::New(TyUint64,instr->m_func);
  pIVar5 = IR::IndirOpnd::New(pRVar2,0x48,TyUint64,instr->m_func,false);
  InsertMove(&pRVar4->super_Opnd,&pIVar5->super_Opnd,instr,true);
  pRVar2 = IR::RegOpnd::New(TyUint64,instr->m_func);
  indexOpnd = IR::RegOpnd::New(TyInt64,instr->m_func);
  bVar1 = Int32Math::Mul(8,propSymOpnd->m_inlineCacheIndex,&local_3c);
  if (bVar1) {
    src = IR::IntConstOpnd::New((ulong)propSymOpnd->m_inlineCacheIndex,TyUint32,instr->m_func,false)
    ;
    InsertMove(&indexOpnd->super_Opnd,&src->super_Opnd,instr,true);
    pIVar5 = IR::IndirOpnd::New(pRVar4,indexOpnd,inlineCacheOffset._3_1_,TyUint64,instr->m_func);
  }
  else {
    pIVar5 = IR::IndirOpnd::New(pRVar4,local_3c,TyUint64,instr->m_func,false);
  }
  InsertMove(&pRVar2->super_Opnd,&pIVar5->super_Opnd,instr,true);
  target_00 = IR::LabelInstr::New(Label,instr->m_func,local_38._0_1_);
  InsertBranch(JMP,false,target_00,instr);
  src_00 = IR::AddrOpnd::New(propSymOpnd->m_runtimeInlineCache,AddrOpndKindDynamicInlineCache,
                             this->m_func,false,(Var)0x0);
  pIVar3 = InsertMove(&pRVar2->super_Opnd,&src_00->super_Opnd,instr,true);
  IR::Instr::InsertBefore(pIVar3,&target->super_Instr);
  IR::Instr::InsertAfter(pIVar3,&target_00->super_Instr);
  return &pRVar2->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GetInlineCacheFromFuncObjectForRuntimeUse(IR::Instr * instr, IR::PropertySymOpnd * propSymOpnd, bool isHelper)
{
    // MOV s1, [ebp + 8]                        //s1 = function object
    // MOV s2, [s1 + offset(hasInlineCaches)]
    // TEST s2, s2
    // JE $L1
    // MOV s3, [s1 + offset(m_inlineCaches)]    //s3 = inlineCaches from function object
    // MOV s4, [s3 + index*scale]               //s4 = inlineCaches[index]
    // JMP $L2
    // $L1
    // MOV s3, propSym->m_runtimeCache
    // $L2

    byte indirScale = this->m_lowererMD.GetDefaultIndirScale();

    IR::RegOpnd * funcObjOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    IR::Instr * funcObjInstr = IR::Instr::New(Js::OpCode::Ld_A, funcObjOpnd, instr->m_func);
    instr->InsertBefore(funcObjInstr);
    LoadFuncExpression(funcObjInstr);

    IR::RegOpnd * funcObjHasInlineCachesOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    this->InsertMove(funcObjHasInlineCachesOpnd, IR::IndirOpnd::New(funcObjOpnd, Js::ScriptFunction::GetOffsetOfHasInlineCaches(), TyUint8, instr->m_func), instr);

    IR::LabelInstr * inlineCachesNullLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, isHelper);
    InsertTestBranch(funcObjHasInlineCachesOpnd, funcObjHasInlineCachesOpnd, Js::OpCode::BrEq_A, inlineCachesNullLabel, instr);

    IR::RegOpnd * inlineCachesOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    Lowerer::InsertMove(inlineCachesOpnd, IR::IndirOpnd::New(funcObjOpnd, Js::ScriptFunctionWithInlineCache::GetOffsetOfInlineCaches(), TyMachPtr, instr->m_func), instr);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, instr->m_func);
    IR::RegOpnd * indexOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
    int inlineCacheOffset;
    if (!Int32Math::Mul(sizeof(Js::InlineCache *), propSymOpnd->m_inlineCacheIndex, &inlineCacheOffset))
    {
        Lowerer::InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(inlineCachesOpnd, inlineCacheOffset, TyMachPtr, instr->m_func), instr);
    }
    else
    {
        Lowerer::InsertMove(indexOpnd, IR::IntConstOpnd::New(propSymOpnd->m_inlineCacheIndex, TyUint32, instr->m_func), instr);
        Lowerer::InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(inlineCachesOpnd, indexOpnd, indirScale, TyMachPtr, instr->m_func), instr);
    }

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, isHelper);
    InsertBranch(LowererMD::MDUncondBranchOpcode, continueLabel, instr);

    IR::Instr * ldCacheFromPropSymOpndInstr = this->InsertMove(inlineCacheOpnd, IR::AddrOpnd::New(propSymOpnd->m_runtimeInlineCache, IR::AddrOpndKindDynamicInlineCache, this->m_func), instr);
    ldCacheFromPropSymOpndInstr->InsertBefore(inlineCachesNullLabel);

    ldCacheFromPropSymOpndInstr->InsertAfter(continueLabel);

    return inlineCacheOpnd;
}